

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitState<unsigned_int>,int,duckdb::BitAndOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t iVar7;
  byte bVar8;
  ulong uVar9;
  idx_t iVar10;
  ulong uVar11;
  UnifiedVectorFormat idata;
  long *local_68;
  long local_60;
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  if (*input == (Vector)0x0) {
    lVar3 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      lVar2 = *(long *)(input + 0x28);
      uVar4 = 0;
      uVar5 = 0;
      do {
        if (lVar2 == 0) {
          uVar9 = 0xffffffffffffffff;
        }
        else {
          uVar9 = *(ulong *)(lVar2 + uVar4 * 8);
        }
        uVar11 = uVar5 + 0x40;
        if (count <= uVar5 + 0x40) {
          uVar11 = count;
        }
        uVar6 = uVar11;
        if (uVar9 != 0) {
          uVar6 = uVar5;
          if (uVar9 == 0xffffffffffffffff) {
            if (uVar5 < uVar11) {
              bVar8 = *state;
              do {
                uVar1 = *(uint *)(lVar3 + uVar6 * 4);
                if ((bVar8 & 1) == 0) {
                  *(uint *)(state + 4) = uVar1;
                  *state = '\x01';
                  bVar8 = 1;
                }
                else {
                  *(uint *)(state + 4) = *(uint *)(state + 4) & uVar1;
                }
                uVar6 = uVar6 + 1;
              } while (uVar11 != uVar6);
            }
          }
          else if (uVar5 < uVar11) {
            uVar6 = 0;
            do {
              if ((uVar9 >> (uVar6 & 0x3f) & 1) != 0) {
                uVar1 = *(uint *)(lVar3 + uVar5 * 4 + uVar6 * 4);
                if (*state == '\0') {
                  *(uint *)(state + 4) = uVar1;
                  *state = '\x01';
                }
                else {
                  *(uint *)(state + 4) = *(uint *)(state + 4) & uVar1;
                }
              }
              uVar6 = uVar6 + 1;
            } while ((uVar5 - uVar11) + uVar6 != 0);
            uVar6 = uVar5 + uVar6;
          }
        }
        uVar4 = uVar4 + 1;
        uVar5 = uVar6;
      } while (uVar4 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      if (*state == '\0') {
        *(uint *)(state + 4) = **(uint **)(input + 0x20);
        *state = '\x01';
      }
      else {
        *(uint *)(state + 4) = *(uint *)(state + 4) & **(uint **)(input + 0x20);
      }
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_68);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_58 == 0) {
      if (count != 0) {
        lVar3 = *local_68;
        bVar8 = *state;
        iVar7 = 0;
        do {
          iVar10 = iVar7;
          if (lVar3 != 0) {
            iVar10 = (idx_t)*(uint *)(lVar3 + iVar7 * 4);
          }
          uVar1 = *(uint *)(local_60 + iVar10 * 4);
          if ((bVar8 & 1) == 0) {
            *(uint *)(state + 4) = uVar1;
            *state = '\x01';
            bVar8 = 1;
          }
          else {
            *(uint *)(state + 4) = *(uint *)(state + 4) & uVar1;
          }
          iVar7 = iVar7 + 1;
        } while (count != iVar7);
      }
    }
    else if (count != 0) {
      lVar3 = *local_68;
      iVar7 = 0;
      do {
        iVar10 = iVar7;
        if (lVar3 != 0) {
          iVar10 = (idx_t)*(uint *)(lVar3 + iVar7 * 4);
        }
        if ((*(ulong *)(local_58 + (iVar10 >> 6) * 8) >> (iVar10 & 0x3f) & 1) != 0) {
          uVar1 = *(uint *)(local_60 + iVar10 * 4);
          if (*state == '\0') {
            *(uint *)(state + 4) = uVar1;
            *state = '\x01';
          }
          else {
            *(uint *)(state + 4) = *(uint *)(state + 4) & uVar1;
          }
        }
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}